

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O2

bool __thiscall
AddrManImpl::Add_(AddrManImpl *this,vector<CAddress,_std::allocator<CAddress>_> *vAddr,
                 CNetAddr *source,seconds time_penalty)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  bool bVar3;
  Logger *pLVar4;
  int iVar5;
  CAddress *pCVar6;
  pointer addr;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  int *in_stack_fffffffffffffee0;
  long local_108;
  int local_100 [2];
  string local_f8 [4];
  string local_78;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = 0;
  pCVar6 = (CAddress *)vAddr;
  for (addr = (vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
              super__Vector_impl_data._M_start;
      addr != (vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
              super__Vector_impl_data._M_finish; addr = addr + 1) {
    pCVar6 = addr;
    bVar2 = AddSingle(this,addr,source,time_penalty);
    iVar5 = iVar5 + (uint)bVar2;
  }
  local_100[0] = iVar5;
  if (iVar5 == 0) {
    bVar2 = false;
  }
  else {
    bVar3 = ::LogAcceptCategory(ADDRMAN,(Level)pCVar6);
    bVar2 = true;
    if (bVar3) {
      local_108 = ((long)(vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                        super__Vector_impl_data._M_start) / 0x38;
      CNetAddr::ToStringAddr_abi_cxx11_(local_f8,source);
      pLVar4 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar4);
      if (bVar2) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<int,unsigned_long,std::__cxx11::string,int,int>
                  (&local_78,(tinyformat *)"Added %i addresses (of %i) from %s: %i tried, %i new\n",
                   (char *)local_100,(int *)&local_108,(unsigned_long *)local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &this->nTried,&this->nNew,in_stack_fffffffffffffee0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        pLVar4 = LogInstance();
        local_78._M_dataplus._M_p = (pointer)0x54;
        local_78._M_string_length = 0xca13c8;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp";
        source_file._M_len = 0x54;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "Add_";
        logging_function._M_len = 4;
        BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x2b0,ADDRMAN,Debug);
        std::__cxx11::string::~string((string *)&log_msg);
      }
      std::__cxx11::string::~string((string *)local_f8);
      bVar2 = 0 < local_100[0];
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool AddrManImpl::Add_(const std::vector<CAddress>& vAddr, const CNetAddr& source, std::chrono::seconds time_penalty)
{
    int added{0};
    for (std::vector<CAddress>::const_iterator it = vAddr.begin(); it != vAddr.end(); it++) {
        added += AddSingle(*it, source, time_penalty) ? 1 : 0;
    }
    if (added > 0) {
        LogDebug(BCLog::ADDRMAN, "Added %i addresses (of %i) from %s: %i tried, %i new\n", added, vAddr.size(), source.ToStringAddr(), nTried, nNew);
    }
    return added > 0;
}